

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O1

nvpair_t * nvlist_next_nvpair(nvlist_t *nvl,nvpair_t *nvp)

{
  nvlist_t *pnVar1;
  nvpair_t *nvp_00;
  char *__assertion;
  
  if (nvl == (nvlist_t *)0x0) {
    __assertion = "(nvl) != ((void*)0)";
  }
  else {
    if (nvl->nvl_magic == 0x6e766c) {
      nvpair_assert(nvp);
      pnVar1 = nvpair_nvlist(nvp);
      if (pnVar1 != nvl) {
        __assert_fail("nvpair_nvlist(nvp) == nvl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                      ,0x546,"nvpair_t *nvlist_next_nvpair(const nvlist_t *, const nvpair_t *)");
      }
      nvp_00 = nvpair_next(nvp);
      if (nvp_00 != (nvpair_t *)0x0) {
        pnVar1 = nvpair_nvlist(nvp_00);
        if (pnVar1 != nvl) {
          __assert_fail("retnvp == ((void*)0) || nvpair_nvlist(retnvp) == nvl",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                        ,0x549,"nvpair_t *nvlist_next_nvpair(const nvlist_t *, const nvpair_t *)");
        }
      }
      return nvp_00;
    }
    __assertion = "(nvl)->nvl_magic == 0x6e766c";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x544,"nvpair_t *nvlist_next_nvpair(const nvlist_t *, const nvpair_t *)");
}

Assistant:

nvpair_t *
nvlist_next_nvpair(const nvlist_t *nvl __unused, const nvpair_t *nvp)
{
	nvpair_t *retnvp;

	NVLIST_ASSERT(nvl);
	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvpair_nvlist(nvp) == nvl);

	retnvp = nvpair_next(nvp);
	PJDLOG_ASSERT(retnvp == NULL || nvpair_nvlist(retnvp) == nvl);

	return (retnvp);

}